

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

int Saig_ManRetimeCountCut(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  ulong *puVar1;
  uint *__ptr;
  void *pvVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  Aig_ManIncrementTravId(p);
  if (0 < vCut->nSize) {
    lVar11 = 0;
    do {
      Saig_ManMarkCone_rec(p,(Aig_Obj_t *)vCut->pArray[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < vCut->nSize);
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar2 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar2;
  pVVar4 = p->vObjs;
  if (pVVar4->nSize < 1) {
    uVar10 = 0;
LAB_006f7fdf:
    if (pvVar2 == (void *)0x0) goto LAB_006f7fec;
  }
  else {
    uVar10 = 0;
    uVar8 = 1000;
    uVar9 = 1000;
    lVar11 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar11];
      if ((pvVar2 != (void *)0x0) && (*(int *)((long)pvVar2 + 0x20) != p->nTravIds)) {
        uVar6 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if ((uVar6 != 0) &&
           (((*(byte *)(uVar6 + 0x18) & 0x10) == 0 && (*(int *)(uVar6 + 0x20) == p->nTravIds)))) {
          uVar7 = (uint)uVar9;
          if (uVar10 == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar3 = malloc(0x80);
              }
              else {
                pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar3;
              *__ptr = 0x10;
              uVar8 = 0x10;
              uVar9 = 0x10;
            }
            else {
              uVar8 = (ulong)(uVar7 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar3 = malloc(uVar8 * 8);
              }
              else {
                pvVar3 = realloc(*(void **)(__ptr + 2),uVar8 * 8);
              }
              *(void **)(__ptr + 2) = pvVar3;
              *__ptr = uVar7 * 2;
              uVar9 = uVar8;
            }
          }
          else {
            pvVar3 = *(void **)(__ptr + 2);
          }
          lVar5 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          __ptr[1] = uVar10;
          *(ulong *)((long)pvVar3 + lVar5 * 8) = uVar6;
          *(byte *)(uVar6 + 0x18) = *(byte *)(uVar6 + 0x18) | 0x10;
        }
        uVar6 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (((uVar6 != 0) && ((*(byte *)(uVar6 + 0x18) & 0x10) == 0)) &&
           (*(int *)(uVar6 + 0x20) == p->nTravIds)) {
          uVar7 = (uint)uVar8;
          if (uVar10 == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar2 = malloc(0x80);
              }
              else {
                pvVar2 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar2;
              *__ptr = 0x10;
              uVar8 = 0x10;
            }
            else {
              uVar8 = (ulong)(uVar7 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar2 = malloc(uVar8 * 8);
              }
              else {
                pvVar2 = realloc(*(void **)(__ptr + 2),uVar8 * 8);
              }
              *(void **)(__ptr + 2) = pvVar2;
              *__ptr = uVar7 * 2;
            }
          }
          else {
            pvVar2 = *(void **)(__ptr + 2);
          }
          lVar5 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          __ptr[1] = uVar10;
          *(ulong *)((long)pvVar2 + lVar5 * 8) = uVar6;
          *(byte *)(uVar6 + 0x18) = *(byte *)(uVar6 + 0x18) | 0x10;
          uVar9 = uVar8;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar4 = p->vObjs;
    } while (lVar11 < pVVar4->nSize);
    pvVar2 = *(void **)(__ptr + 2);
    if ((int)uVar10 < 1) goto LAB_006f7fdf;
    uVar9 = 0;
    do {
      puVar1 = (ulong *)(*(long *)((long)pvVar2 + uVar9 * 8) + 0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffef;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  free(pvVar2);
LAB_006f7fec:
  free(__ptr);
  return uVar10;
}

Assistant:

int Saig_ManRetimeCountCut( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, RetValue;
    // mark the cones
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        Saig_ManMarkCone_rec( p, pObj );
    // collect the new cut
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->fMarkA = 0;
    RetValue = Vec_PtrSize( vNodes );
    Vec_PtrFree( vNodes );
    return RetValue;
}